

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O1

btBvhTriangleMeshShape * __thiscall
btCollisionWorldImporter::createBvhTriangleMeshShape
          (btCollisionWorldImporter *this,btStridingMeshInterface *trimesh,btOptimizedBvh *bvh)

{
  int iVar1;
  int iVar2;
  btCollisionShape **ptr;
  btBvhTriangleMeshShape *this_00;
  btCollisionShape **ppbVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  btVector3 local_38;
  
  this_00 = (btBvhTriangleMeshShape *)btAlignedAllocInternal(0x68,0x10);
  if (bvh == (btOptimizedBvh *)0x0) {
    btBvhTriangleMeshShape::btBvhTriangleMeshShape(this_00,trimesh,true,true);
    iVar1 = (this->m_allocatedCollisionShapes).m_size;
    iVar2 = (this->m_allocatedCollisionShapes).m_capacity;
    if (iVar1 != iVar2) goto LAB_0014ad5f;
    iVar6 = 1;
    if (iVar1 != 0) {
      iVar6 = iVar1 * 2;
    }
    if (iVar6 <= iVar2) goto LAB_0014ad5f;
    if (iVar6 == 0) {
      ppbVar3 = (btCollisionShape **)0x0;
    }
    else {
      ppbVar3 = (btCollisionShape **)btAlignedAllocInternal((long)iVar6 << 3,0x10);
    }
    lVar4 = (long)(this->m_allocatedCollisionShapes).m_size;
    if (0 < lVar4) {
      lVar5 = 0;
      do {
        ppbVar3[lVar5] = (this->m_allocatedCollisionShapes).m_data[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
    }
  }
  else {
    btBvhTriangleMeshShape::btBvhTriangleMeshShape
              (this_00,trimesh,(bvh->super_btQuantizedBvh).m_useQuantization,false);
    local_38.m_floats[0] = 1.0;
    local_38.m_floats[1] = 1.0;
    local_38.m_floats[2] = 1.0;
    local_38.m_floats[3] = 0.0;
    btBvhTriangleMeshShape::setOptimizedBvh(this_00,bvh,&local_38);
    iVar1 = (this->m_allocatedCollisionShapes).m_size;
    iVar2 = (this->m_allocatedCollisionShapes).m_capacity;
    if (iVar1 != iVar2) goto LAB_0014ad5f;
    iVar6 = 1;
    if (iVar1 != 0) {
      iVar6 = iVar1 * 2;
    }
    if (iVar6 <= iVar2) goto LAB_0014ad5f;
    if (iVar6 == 0) {
      ppbVar3 = (btCollisionShape **)0x0;
    }
    else {
      ppbVar3 = (btCollisionShape **)btAlignedAllocInternal((long)iVar6 << 3,0x10);
    }
    lVar4 = (long)(this->m_allocatedCollisionShapes).m_size;
    if (0 < lVar4) {
      lVar5 = 0;
      do {
        ppbVar3[lVar5] = (this->m_allocatedCollisionShapes).m_data[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
    }
  }
  ptr = (this->m_allocatedCollisionShapes).m_data;
  if (ptr != (btCollisionShape **)0x0) {
    if ((this->m_allocatedCollisionShapes).m_ownsMemory == true) {
      btAlignedFreeInternal(ptr);
    }
    (this->m_allocatedCollisionShapes).m_data = (btCollisionShape **)0x0;
  }
  (this->m_allocatedCollisionShapes).m_ownsMemory = true;
  (this->m_allocatedCollisionShapes).m_data = ppbVar3;
  (this->m_allocatedCollisionShapes).m_capacity = iVar6;
LAB_0014ad5f:
  iVar1 = (this->m_allocatedCollisionShapes).m_size;
  (this->m_allocatedCollisionShapes).m_data[iVar1] = (btCollisionShape *)this_00;
  (this->m_allocatedCollisionShapes).m_size = iVar1 + 1;
  return this_00;
}

Assistant:

btBvhTriangleMeshShape* btCollisionWorldImporter::createBvhTriangleMeshShape(btStridingMeshInterface* trimesh, btOptimizedBvh* bvh)
{
	if (bvh)
	{
		btBvhTriangleMeshShape* bvhTriMesh = new btBvhTriangleMeshShape(trimesh,bvh->isQuantized(), false);
		bvhTriMesh->setOptimizedBvh(bvh);
		m_allocatedCollisionShapes.push_back(bvhTriMesh);
		return bvhTriMesh;
	}

	btBvhTriangleMeshShape* ts = new btBvhTriangleMeshShape(trimesh,true);
	m_allocatedCollisionShapes.push_back(ts);
	return ts;

}